

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::VideoTrack::SetStereoMode(VideoTrack *this,uint64_t stereo_mode)

{
  if ((stereo_mode < 4) || (stereo_mode == 0xb)) {
    this->stereo_mode_ = stereo_mode;
  }
  return stereo_mode == 0xb || stereo_mode < 4;
}

Assistant:

bool VideoTrack::SetStereoMode(uint64_t stereo_mode) {
  if (stereo_mode != kMono && stereo_mode != kSideBySideLeftIsFirst &&
      stereo_mode != kTopBottomRightIsFirst &&
      stereo_mode != kTopBottomLeftIsFirst &&
      stereo_mode != kSideBySideRightIsFirst)
    return false;

  stereo_mode_ = stereo_mode;
  return true;
}